

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

bool caffe::SolverParameter_SolverMode_IsValid(int value)

{
  return (uint)value < 2;
}

Assistant:

bool SolverParameter_SolverMode_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
      return true;
    default:
      return false;
  }
}